

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST_Parser.cpp
# Opt level: O1

shared_ptr<nigel::AstReturning> __thiscall
nigel::AST_Parser::splitMostRightExpr
          (AST_Parser *this,shared_ptr<nigel::AstExpr> *currLVal,
          shared_ptr<nigel::AstFunctionCall> *cExpr,int priority)

{
  map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
  *this_00;
  bool bVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  mapped_type *pmVar4;
  undefined4 in_register_0000000c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_02;
  int in_R8D;
  _func_int **pp_Var6;
  bool bVar7;
  bool bVar8;
  shared_ptr<nigel::AstReturning> sVar9;
  undefined1 local_88 [32];
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_58;
  _func_int **local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  local_68 = (element_type *)CONCAT44(in_register_0000000c,priority);
  this_00 = (map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
             *)(currLVal + 2);
  local_58 = &(cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount;
  pp_Var6 = (_func_int **)0x0;
  this_01 = (element_type *)0x0;
  local_88._24_8_ = currLVal;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  do {
    bVar7 = (((cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             )->super_AstReturning).super_AstExpr.type == term;
    if (bVar7) {
      AstExpr::as<nigel::AstTerm>((AstExpr *)&local_40);
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)&local_40._M_pi[5]._M_use_count);
      if (in_R8D <= *pmVar4) goto LAB_001393a7;
      bVar7 = true;
      bVar1 = false;
      bVar8 = true;
    }
    else {
LAB_001393a7:
      local_88._0_4_ = 0x2d;
      pmVar4 = std::
               map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
               ::operator[](this_00,(key_type *)local_88);
      if (*pmVar4 == in_R8D) {
        AstExpr::as<nigel::AstTerm>((AstExpr *)&local_50);
        pmVar4 = std::
                 map<nigel::Token::Type,_int,_std::less<nigel::Token::Type>,_std::allocator<std::pair<const_nigel::Token::Type,_int>_>_>
                 ::operator[](this_00,(key_type *)(local_50 + 0xb));
        bVar8 = *pmVar4 == in_R8D;
        bVar1 = true;
      }
      else {
        bVar1 = false;
        bVar8 = false;
      }
    }
    if ((bVar1) && (local_48 != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
    }
    if ((bVar7) && (local_38 != (element_type *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
    if (!bVar8) {
      if (pp_Var6 == (_func_int **)0x0) {
        (((shared_ptr<nigel::AstExpr> *)(local_88._24_8_ + 0xb0))->
        super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)local_68->_vptr_Token;
        this_02 = &(((shared_ptr<nigel::AstExpr> *)(local_88._24_8_ + 0xb0))->
                   super___shared_ptr<nigel::AstExpr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      }
      else {
        pp_Var6[9] = (_func_int *)local_68->_vptr_Token;
        this_02 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(pp_Var6 + 10);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (this_02,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_68->super_enable_shared_from_this<nigel::Token>);
      _Var3._M_pi = local_60._M_pi;
      sVar9 = AstExpr::as<nigel::AstReturning>((AstExpr *)local_60._M_pi);
      _Var5 = sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
      if (this_01 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        _Var5._M_pi = extraout_RDX;
      }
      sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var5._M_pi;
      sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_pi;
      return (shared_ptr<nigel::AstReturning>)
             sVar9.super___shared_ptr<nigel::AstReturning,_(__gnu_cxx::_Lock_policy)2>;
    }
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
    uVar2 = local_88._8_8_;
    pp_Var6 = (_func_int **)local_88._0_8_;
    local_88._0_8_ = (_func_int **)0x0;
    local_88._8_8_ = (element_type *)0x0;
    if (this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
    AstExpr::as<nigel::AstTerm>((AstExpr *)local_88);
    (cExpr->super___shared_ptr<nigel::AstFunctionCall,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         *(element_type **)(local_88._0_8_ + 0x48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (local_58,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88._0_8_ + 0x50));
    this_01 = (element_type *)uVar2;
    if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
    }
  } while( true );
}

Assistant:

std::shared_ptr<AstReturning> AST_Parser::splitMostRightExpr( std::shared_ptr<AstExpr> currLVal, std::shared_ptr<AstFunctionCall> cExpr, int priority )
	{
		//Check if lValue is a term
		std::shared_ptr<AstTerm> clTerm = nullptr;
		while( ( currLVal->type == AstExpr::Type::term && opPriority[currLVal->as<AstTerm>()->op] < priority ) ||
			( priority == opPriority[TT::op_set] && opPriority[currLVal->as<AstTerm>()->op] == priority ) )
		{//Check if lTerm has to be splitted up
			clTerm = currLVal->as<AstTerm>();
			currLVal = currLVal->as<AstTerm>()->rVal;
		}

		//Test for lTerm
		if( clTerm != nullptr )
		{//Min. 1 term was splitted up
			clTerm->rVal = cExpr;
			return currLVal->as<AstReturning>();
		}
		else
		{//LValue is a atomic astExpr
			lValue = cExpr;//Set as lValue
			return currLVal->as<AstReturning>();
		}
	}